

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void lab6(Node *ast)

{
  Node local_50;
  Node *local_10;
  Node *ast_local;
  
  local_10 = ast;
  Node::Node(&local_50,ast);
  printTree(&local_50,0);
  Node::~Node(&local_50);
  return;
}

Assistant:

void lab6(Node &ast) {
    printTree(ast, 0);
}